

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

EitherFlag * __thiscall args::Matcher::GetShortOrAny(Matcher *this)

{
  bool bVar1;
  EitherFlag *in_RDI;
  char flag;
  EitherFlag *this_00;
  
  this_00 = in_RDI;
  bVar1 = std::unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>::
          empty((unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_> *)
                0x211c99);
  if (bVar1) {
    bVar1 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x211cd2);
    if (bVar1) {
      EitherFlag::EitherFlag(this_00,(char)((ulong)in_RDI >> 0x38));
    }
    else {
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_RDI);
      std::__detail::
      _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
      ::operator*((_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                   *)0x211cf3);
      EitherFlag::EitherFlag(this_00,(string *)in_RDI);
    }
  }
  else {
    std::unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>::begin
              ((unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_> *)
               in_RDI);
    flag = (char)((ulong)in_RDI >> 0x38);
    std::__detail::_Node_const_iterator<char,_true,_false>::operator*
              ((_Node_const_iterator<char,_true,_false> *)0x211cb6);
    EitherFlag::EitherFlag(this_00,flag);
  }
  return this_00;
}

Assistant:

EitherFlag GetShortOrAny() const
            {
                if (!shortFlags.empty())
                {
                    return *shortFlags.begin();
                }

                if (!longFlags.empty())
                {
                    return *longFlags.begin();
                }

                // should be unreachable
                return ' ';
            }